

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsPixmapItemPrivate::updateShape(QGraphicsPixmapItemPrivate *this)

{
  int iVar1;
  ulong uVar2;
  QRectF *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  qreal aleft;
  qreal atop;
  double awidth;
  QBitmap mask;
  QPainterPath *in_stack_ffffffffffffff18;
  QPainterPath *in_stack_ffffffffffffff20;
  QPointF *in_stack_ffffffffffffff30;
  QRegion *in_stack_ffffffffffffff38;
  QBitmap local_98 [24];
  QRegion local_80;
  QRegion local_78;
  QPainterPath local_70 [8];
  QRectF local_68;
  QPoint local_48;
  QRegion local_40;
  QRegion local_38;
  QPainterPath local_30 [8];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QPainterPath local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPainterPath::QPainterPath(local_10);
  QPainterPath::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  QPainterPath::~QPainterPath(local_10);
  iVar1 = *(int *)(in_RDI + 0x1a8);
  if (iVar1 == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::mask();
    uVar2 = QPixmap::isNull();
    bVar4 = (uVar2 & 1) == 0;
    if (bVar4) {
      QRegion::QRegion(&local_40,(QBitmap *)&local_28);
      local_48 = QPointF::toPoint(in_stack_ffffffffffffff30);
      QRegion::translated(in_stack_ffffffffffffff38,(QPoint *)in_stack_ffffffffffffff30);
      qt_regionToPath((QRegion *)local_30);
      QPainterPath::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      QPainterPath::~QPainterPath(local_30);
      QRegion::~QRegion(&local_38);
      QRegion::~QRegion(&local_40);
    }
    QBitmap::~QBitmap((QBitmap *)&local_28);
    if (bVar4) goto LAB_00997e01;
  }
  else if (iVar1 != 1) {
    if (iVar1 == 2) {
      QPixmap::createHeuristicMask(SUB81(local_98,0));
      QRegion::QRegion(&local_80,local_98);
      QPointF::toPoint(in_stack_ffffffffffffff30);
      QRegion::translated(in_stack_ffffffffffffff38,(QPoint *)in_stack_ffffffffffffff30);
      qt_regionToPath((QRegion *)local_70);
      QPainterPath::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      QPainterPath::~QPainterPath(local_70);
      QRegion::~QRegion(&local_78);
      QRegion::~QRegion(&local_80);
      QBitmap::~QBitmap(local_98);
    }
    goto LAB_00997e01;
  }
  pQVar3 = (QRectF *)(in_RDI + 0x1b0);
  aleft = QPointF::x((QPointF *)(in_RDI + 0x198));
  atop = QPointF::y((QPointF *)(in_RDI + 0x198));
  iVar1 = QPixmap::width();
  awidth = (double)iVar1;
  iVar1 = QPixmap::height();
  QRectF::QRectF(&local_68,aleft,atop,awidth,(double)iVar1);
  QPainterPath::addRect(pQVar3);
LAB_00997e01:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void updateShape()
    {
        shape = QPainterPath();
        switch (shapeMode) {
        case QGraphicsPixmapItem::MaskShape: {
            QBitmap mask = pixmap.mask();
            if (!mask.isNull()) {
                shape = qt_regionToPath(QRegion(mask).translated(offset.toPoint()));
                break;
            }
            Q_FALLTHROUGH();
        }
        case QGraphicsPixmapItem::BoundingRectShape:
            shape.addRect(QRectF(offset.x(), offset.y(), pixmap.width(), pixmap.height()));
            break;
        case QGraphicsPixmapItem::HeuristicMaskShape:
#ifndef QT_NO_IMAGE_HEURISTIC_MASK
            shape = qt_regionToPath(QRegion(pixmap.createHeuristicMask()).translated(offset.toPoint()));
#else
            shape.addRect(QRectF(offset.x(), offset.y(), pixmap.width(), pixmap.height()));
#endif
            break;
        }
    }